

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  SystemInfo *pSVar4;
  InstanceBuilder *this;
  Instance *pIVar5;
  error_code eVar6;
  undefined1 auStack_268 [8];
  Instance vkb_inst;
  error_code local_228;
  string local_218;
  undefined1 local_1f8 [8];
  Result<vkb::Instance> inst_ret;
  SystemInfo system_info;
  error_code local_178;
  string local_168;
  undefined1 local_138 [8];
  Result<vkb::SystemInfo> system_info_ret;
  InstanceBuilder instance_builder;
  
  vkb::InstanceBuilder::InstanceBuilder((InstanceBuilder *)&system_info_ret.m_init);
  vkb::SystemInfo::get_system_info();
  bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_138);
  if (bVar1) {
    pSVar4 = vkb::Result<vkb::SystemInfo>::value((Result<vkb::SystemInfo> *)local_138);
    vkb::SystemInfo::SystemInfo((SystemInfo *)&inst_ret.m_init,pSVar4);
    bVar1 = vkb::SystemInfo::is_layer_available
                      ((SystemInfo *)&inst_ret.m_init,"VK_LAYER_LUNARG_api_dump");
    if (bVar1) {
      vkb::InstanceBuilder::enable_layer
                ((InstanceBuilder *)&system_info_ret.m_init,"VK_LAYER_LUNARG_api_dump");
    }
    if (((byte)system_info.available_extensions.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
      this = vkb::InstanceBuilder::enable_validation_layers
                       ((InstanceBuilder *)&system_info_ret.m_init,true);
      vkb::InstanceBuilder::use_default_debug_messenger(this);
    }
    bVar1 = vkb::SystemInfo::is_extension_available
                      ((SystemInfo *)&inst_ret.m_init,"VK_KHR_get_physical_device_properties2");
    if (bVar1) {
      vkb::InstanceBuilder::enable_extension
                ((InstanceBuilder *)&system_info_ret.m_init,"VK_KHR_get_physical_device_properties2"
                );
    }
    vkb::InstanceBuilder::build
              ((Result<vkb::Instance> *)local_1f8,(InstanceBuilder *)&system_info_ret.m_init);
    bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_1f8);
    if (bVar1) {
      pIVar5 = vkb::Result<vkb::Instance>::value((Result<vkb::Instance> *)local_1f8);
      vkb_inst._40_8_ = *(undefined8 *)&pIVar5->headless;
      auStack_268 = (undefined1  [8])pIVar5->instance;
      vkb_inst.instance = (VkInstance)pIVar5->debug_messenger;
      vkb_inst.debug_messenger = (VkDebugUtilsMessengerEXT)pIVar5->allocation_callbacks;
      vkb_inst.allocation_callbacks = (VkAllocationCallbacks *)pIVar5->fp_vkGetInstanceProcAddr;
      vkb_inst.fp_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)pIVar5->fp_vkGetDeviceProcAddr;
      vkb_inst.fp_vkGetDeviceProcAddr = *(PFN_vkGetDeviceProcAddr *)&pIVar5->instance_version;
      vkb::destroy_instance((Instance *)auStack_268);
      instance_builder.info.fp_vkGetInstanceProcAddr._4_4_ = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ");
      eVar6 = vkb::Result<vkb::Instance>::error((Result<vkb::Instance> *)local_1f8);
      local_228._M_cat = eVar6._M_cat;
      local_228._M_value = eVar6._M_value;
      std::error_code::message_abi_cxx11_(&local_218,&local_228);
      poVar3 = std::operator<<(poVar3,(string *)&local_218);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_218);
      instance_builder.info.fp_vkGetInstanceProcAddr._4_4_ = -1;
    }
    vkb::Result<vkb::Instance>::~Result((Result<vkb::Instance> *)local_1f8);
    vkb::SystemInfo::~SystemInfo((SystemInfo *)&inst_ret.m_init);
  }
  else {
    eVar6 = vkb::Result<vkb::SystemInfo>::error((Result<vkb::SystemInfo> *)local_138);
    local_178._M_cat = eVar6._M_cat;
    local_178._M_value = eVar6._M_value;
    std::error_code::message_abi_cxx11_(&local_168,&local_178);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_168);
    instance_builder.info.fp_vkGetInstanceProcAddr._4_4_ = -1;
  }
  vkb::Result<vkb::SystemInfo>::~Result((Result<vkb::SystemInfo> *)local_138);
  vkb::InstanceBuilder::~InstanceBuilder((InstanceBuilder *)&system_info_ret.m_init);
  return instance_builder.info.fp_vkGetInstanceProcAddr._4_4_;
}

Assistant:

int main() {
    vkb::InstanceBuilder instance_builder;

    auto system_info_ret = vkb::SystemInfo::get_system_info();
    if (!system_info_ret) {
        std::cerr << system_info_ret.error().message().c_str() << "\n";
        return -1;
    }
    auto system_info = system_info_ret.value();

    // check for a layer
    if (system_info.is_layer_available("VK_LAYER_LUNARG_api_dump")) {
        instance_builder.enable_layer("VK_LAYER_LUNARG_api_dump");
    }

    // of course dedicated variable for validation
    if (system_info.validation_layers_available) {
        instance_builder
            .enable_validation_layers()
            // Validation needs to send errors via a callback, have vk-bootstrap do it
            .use_default_debug_messenger();
    }

    // if you need an instance level extension
    if (system_info.is_extension_available("VK_KHR_get_physical_device_properties2")) {
        instance_builder.enable_extension("VK_KHR_get_physical_device_properties2");
    }

    // Build instance now!
    auto inst_ret = instance_builder.build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return -1;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    // fancy app logic

    vkb::destroy_instance(vkb_inst);
    return 0;
}